

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *p,int nPref)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  if (p->vNonXRegs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNonXRegs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0xe6,"int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *, int)");
  }
  uVar6 = p->pAig->nRegs;
  pVVar3 = Vec_IntAlloc(10);
  p->vNonXRegs = pVVar3;
  uVar8 = 0;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  do {
    if (uVar8 == uVar6) {
      return p->vNonXRegs->nSize;
    }
    uVar7 = uVar8 * 2 & 0x1e;
    iVar9 = nPref;
    while( true ) {
      iVar2 = p->vStates->nSize;
      if (iVar2 <= iVar9) break;
      pvVar4 = Vec_PtrEntry(p->vStates,iVar9);
      uVar1 = *(uint *)((long)pvVar4 + (ulong)(uVar8 >> 4) * 4);
      iVar2 = (uint)((uVar1 >> uVar7 & 1) != 0) + (uVar1 >> ((char)uVar7 + 1U & 0x1f) & 1) * 2;
      if (iVar2 == 3) {
        iVar2 = p->vStates->nSize;
        break;
      }
      if (iVar2 == 0) {
        __assert_fail("Value != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                      ,0xed,"int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *, int)");
      }
      iVar9 = iVar9 + 1;
    }
    if (iVar2 == iVar9) {
      pVVar3 = p->vNonXRegs;
      iVar9 = pVVar3->nSize;
      if (iVar9 == pVVar3->nCap) {
        uVar7 = iVar9 * 2;
        if (iVar9 < 0x10) {
          uVar7 = 0x10;
        }
        if (iVar9 < (int)uVar7) {
          if (pVVar3->pArray == (int *)0x0) {
            piVar5 = (int *)malloc((ulong)uVar7 << 2);
          }
          else {
            piVar5 = (int *)realloc(pVVar3->pArray,(ulong)uVar7 << 2);
          }
          pVVar3->pArray = piVar5;
          if (piVar5 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar3->nCap = uVar7;
          iVar9 = pVVar3->nSize;
        }
      }
      pVVar3->nSize = iVar9 + 1;
      pVVar3->pArray[iVar9] = uVar8;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int Saig_TsiCountNonXValuedRegisters( Saig_Tsim_t * p, int nPref )
{
    unsigned * pState;
    int nRegs = p->pAig->nRegs;
    int Value, i, k;
    assert( p->vNonXRegs == NULL );
    p->vNonXRegs = Vec_IntAlloc( 10 );
    for ( i = 0; i < nRegs; i++ )
    {
        Vec_PtrForEachEntryStart( unsigned *, p->vStates, pState, k, nPref )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            assert( Value != 0 );
            if ( Value == SAIG_XVSX )
                break;
        }
        if ( k == Vec_PtrSize(p->vStates) )
            Vec_IntPush( p->vNonXRegs, i );
    }
    return Vec_IntSize(p->vNonXRegs);
}